

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Builder * __thiscall
capnp::anon_unknown_0::MembraneCapTableBuilder::imbue
          (Builder *__return_storage_ptr__,MembraneCapTableBuilder *this,Builder builder)

{
  CapTableBuilder *pCVar1;
  PointerBuilder pointerBuilder;
  
  if (this->inner == (CapTableBuilder *)0x0) {
    pointerBuilder.pointer = builder.builder.pointer;
    pointerBuilder.segment = builder.builder.segment;
    pointerBuilder.capTable = builder.builder.capTable;
    pCVar1 = capnp::_::PointerBuilder::getCapTable(&pointerBuilder);
    this->inner = pCVar1;
    capnp::_::PointerBuilder::imbue
              (&__return_storage_ptr__->builder,&pointerBuilder,&this->super_CapTableBuilder);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
            ((Fault *)&pointerBuilder,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane.c++"
             ,0x52,FAILED,"inner == nullptr","\"can only call this once\"",
             (char (*) [24])"can only call this once");
  kj::_::Debug::Fault::fatal((Fault *)&pointerBuilder);
}

Assistant:

AnyPointer::Builder imbue(AnyPointer::Builder builder) {
    KJ_REQUIRE(inner == nullptr, "can only call this once");
    auto pointerBuilder = _::PointerHelpers<AnyPointer>::getInternalBuilder(kj::mv(builder));
    inner = pointerBuilder.getCapTable();
    return AnyPointer::Builder(pointerBuilder.imbue(this));
  }